

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Tree::lookup_result::unresolved(lookup_result *this)

{
  csubstr cVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RDI;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *local_10;
  size_t local_8;
  
  if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x10)) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_ffffffffffffffd0 =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            ((basic_substring<const_char> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  cVar1.len = local_8;
  cVar1.str = local_10;
  return cVar1;
}

Assistant:

csubstr Tree::lookup_result::unresolved() const
{
    return path.sub(path_pos);
}